

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O1

void __thiscall
webrtc::NonlinearBeamformer::InitLowFrequencyCorrectionRanges(NonlinearBeamformer *this)

{
  size_t *v1;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  string *result;
  int iVar3;
  ulong uVar4;
  float fVar5;
  FatalMessage local_1a0;
  
  iVar3 = this->sample_rate_hz_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar3;
  result = (string *)0x0;
  fVar5 = floorf((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xc800)) / auVar1,0) + 0.5);
  uVar4 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
  v1 = &this->low_mean_start_bin_;
  this->low_mean_start_bin_ = uVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  fVar5 = floorf((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x19000)) / auVar2,0) + 0.5);
  this->low_mean_end_bin_ = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
  local_1a0.stream_ = (ostringstream)0x0;
  local_1a0._1_3_ = 0;
  if (uVar4 == 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (v1,(uint *)&local_1a0,"low_mean_start_bin_ > 0U");
  }
  if (result == (string *)0x0) {
    if (*v1 < this->low_mean_end_bin_) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (v1,&this->low_mean_end_bin_,"low_mean_start_bin_ < low_mean_end_bin_");
    }
    if (result == (string *)0x0) {
      return;
    }
    iVar3 = 0xf5;
  }
  else {
    iVar3 = 0xf4;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
             ,iVar3,result);
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

void NonlinearBeamformer::InitLowFrequencyCorrectionRanges() {
  low_mean_start_bin_ = Round(kLowMeanStartHz * kFftSize / sample_rate_hz_);
  low_mean_end_bin_ = Round(kLowMeanEndHz * kFftSize / sample_rate_hz_);

  RTC_DCHECK_GT(low_mean_start_bin_, 0U);
  RTC_DCHECK_LT(low_mean_start_bin_, low_mean_end_bin_);
}